

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O1

void If_CluSemiCanonicizeVerify
               (word *pTruth,word *pTruth0,int nVars,int *pCanonPerm,uint uCanonPhase)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  uint iVar;
  ulong uVar5;
  word *pOut;
  word *__dest;
  word *pIn;
  bool bVar6;
  word pGunc [1024];
  word pFunc [1024];
  uint local_4038 [2048];
  word local_2038 [1025];
  
  uVar3 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar3 = 1;
  }
  uVar4 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    memcpy(local_4038,pTruth,uVar4 * 8);
  }
  bVar6 = false;
  __dest = local_2038;
  pIn = pTruth;
  do {
    bVar2 = true;
    if (1 < nVars) {
      uVar5 = 0;
      bVar2 = false;
      pOut = __dest;
      do {
        iVar1 = pCanonPerm[uVar5];
        __dest = pOut;
        if (pCanonPerm[uVar5 + 1] <= iVar1) {
          bVar6 = (bool)(bVar6 ^ 1);
          pCanonPerm[uVar5] = pCanonPerm[uVar5 + 1];
          pCanonPerm[uVar5 + 1] = iVar1;
          If_CluSwapAdjacent(pOut,pIn,(int)uVar5,nVars);
          bVar2 = true;
          __dest = pIn;
          pIn = pOut;
        }
        uVar5 = uVar5 + 1;
        pOut = __dest;
      } while (nVars - 1 != uVar5);
      bVar2 = !bVar2;
    }
  } while (!bVar2);
  if ((0 < (int)uVar3) && (bVar6)) {
    memcpy(__dest,pIn,uVar4 * 8);
  }
  if (0 < nVars) {
    iVar = 0;
    do {
      if ((uCanonPhase >> (iVar & 0x1f) & 1) != 0) {
        If_CluChangePhase(pTruth,nVars,iVar);
      }
      iVar = iVar + 1;
    } while (nVars != iVar);
  }
  if (0 < (int)uVar3) {
    uVar5 = 0;
    do {
      if (pTruth0[uVar5] != pTruth[uVar5]) {
        Kit_DsdPrintFromTruth((uint *)pTruth0,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth(local_4038,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)pTruth,nVars);
        putchar(10);
        puts("SemiCanonical verification FAILED!");
        return;
      }
      uVar5 = uVar5 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void If_CluSemiCanonicizeVerify( word * pTruth, word * pTruth0, int nVars, int * pCanonPerm, unsigned uCanonPhase )
{
    word pFunc[CLU_WRD_MAX], pGunc[CLU_WRD_MAX], * pIn = pTruth, * pOut = pFunc, * pTemp;
    int i, Temp, fChange, Counter = 0;
    If_CluCopy( pGunc, pTruth, nVars );
    // undo permutation
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pCanonPerm[i] < pCanonPerm[i+1] )
                continue;

            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            If_CluSwapAdjacent( pOut, pIn, i, nVars );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    if ( Counter & 1 )
        If_CluCopy( pOut, pIn, nVars );
    // undo phase
    for ( i = 0; i < nVars; i++ )
        if ( (uCanonPhase >> i) & 1 )
            If_CluChangePhase( pTruth, nVars, i );
    // compare
    if ( !If_CluEqual(pTruth0, pTruth, nVars) )
    {
        Kit_DsdPrintFromTruth( (unsigned*)pTruth0, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pGunc, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );
        printf( "SemiCanonical verification FAILED!\n" );
    }
}